

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST(string *stepName,cmJSONState *state)

{
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  string *stepName_local;
  
  local_18 = state;
  state_local = (cmJSONState *)stepName;
  cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[25]>
            (&local_38,(char (*) [26])"Configure workflow step \"",stepName,
             (char (*) [25])"\" must be the first step");
  cmJSONState::AddError(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CONFIGURE_WORKFLOW_STEP_NOT_FIRST(const std::string& stepName,
                                       cmJSONState* state)
{
  state->AddError(cmStrCat("Configure workflow step \"", stepName,
                           "\" must be the first step"));
}